

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nsf_Emu.cpp
# Opt level: O1

blargg_err_t __thiscall Nsf_Emu::init_sound(Nsf_Emu *this)

{
  uint8_t *puVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  Nes_Namco_Apu *this_00;
  Nes_Vrc6_Apu *pNVar4;
  Nes_Fme7_Apu *this_01;
  long lVar5;
  char *pcVar6;
  undefined1 auVar7 [16];
  double local_20;
  long lVar8;
  
  bVar2 = (this->header_).chip_flags;
  if ((bVar2 & 0xce) != 0) {
    (this->super_Classic_Emu).super_Music_Emu.super_Gme_File.warning_ =
         "Uses unsupported audio expansion hardware";
  }
  (this->super_Classic_Emu).super_Music_Emu.voice_count_ = 5;
  (this->super_Classic_Emu).super_Music_Emu.voice_names_ = init_sound::apu_names;
  (this->super_Classic_Emu).voice_types = init_sound::types;
  if ((bVar2 & 0x31) != 0) {
    (this->super_Classic_Emu).super_Music_Emu.voice_count_ = 8;
  }
  local_20 = (this->super_Classic_Emu).super_Music_Emu.gain_;
  if ((bVar2 & 0x10) == 0) {
LAB_006b8fa2:
    if (((this->header_).chip_flags & 1) != 0) {
      pNVar4 = (Nes_Vrc6_Apu *)malloc(0x5c8);
      if (pNVar4 == (Nes_Vrc6_Apu *)0x0) {
        pNVar4 = (Nes_Vrc6_Apu *)0x0;
      }
      else {
        Nes_Vrc6_Apu::Nes_Vrc6_Apu(pNVar4);
      }
      this->vrc6 = pNVar4;
      if (pNVar4 == (Nes_Vrc6_Apu *)0x0) goto LAB_006b91e4;
      local_20 = local_20 * 0.75;
      (this->super_Classic_Emu).super_Music_Emu.voice_count_ = 8;
      (this->super_Classic_Emu).super_Music_Emu.voice_names_ = init_sound()::names;
      if (((this->header_).chip_flags & 0x10) != 0) {
        (this->super_Classic_Emu).super_Music_Emu.voice_count_ = 0x10;
        (this->super_Classic_Emu).super_Music_Emu.voice_names_ = init_sound()::names;
      }
    }
    if (((this->header_).chip_flags & 0x20) != 0) {
      this_01 = (Nes_Fme7_Apu *)malloc(0x380);
      if (this_01 == (Nes_Fme7_Apu *)0x0) {
        this_01 = (Nes_Fme7_Apu *)0x0;
      }
      else {
        Blip_Synth_::Blip_Synth_(&(this_01->synth).impl,(this_01->synth).impulses,0xc);
        auVar3 = _DAT_007140f0;
        lVar5 = 0x28;
        auVar7 = _DAT_00771ac0;
        do {
          if (SUB164(auVar7 ^ auVar3,4) == -0x80000000 && SUB164(auVar7 ^ auVar3,0) < -0x7ffffffd) {
            puVar1 = (this_01->super_fme7_apu_state_t).regs + lVar5 + -0x10;
            puVar1[0] = '\0';
            puVar1[1] = '\0';
            puVar1[2] = '\0';
            puVar1[3] = '\0';
            puVar1[4] = '\0';
            puVar1[5] = '\0';
            puVar1[6] = '\0';
            puVar1[7] = '\0';
            puVar1 = (this_01->super_fme7_apu_state_t).regs + lVar5;
            puVar1[0] = '\0';
            puVar1[1] = '\0';
            puVar1[2] = '\0';
            puVar1[3] = '\0';
            puVar1[4] = '\0';
            puVar1[5] = '\0';
            puVar1[6] = '\0';
            puVar1[7] = '\0';
          }
          lVar8 = auVar7._8_8_;
          auVar7._0_8_ = auVar7._0_8_ + 2;
          auVar7._8_8_ = lVar8 + 2;
          lVar5 = lVar5 + 0x20;
        } while (lVar5 != 0x68);
        Blip_Synth_::volume_unit(&(this_01->synth).impl,0.001979166666666667);
        Nes_Fme7_Apu::reset(this_01);
      }
      this->fme7 = this_01;
      if (this_01 == (Nes_Fme7_Apu *)0x0) goto LAB_006b91e4;
      local_20 = local_20 * 0.75;
      (this->super_Classic_Emu).super_Music_Emu.voice_count_ = 8;
      (this->super_Classic_Emu).super_Music_Emu.voice_names_ = init_sound()::names;
    }
    if (this->namco != (Nes_Namco_Apu *)0x0) {
      Blip_Synth_::volume_unit(&(this->namco->synth).impl,local_20 * 0.0008333333333333334);
    }
    pNVar4 = this->vrc6;
    if (pNVar4 != (Nes_Vrc6_Apu *)0x0) {
      Blip_Synth_::volume_unit(&(pNVar4->saw_synth).impl,local_20 * 0.006238709677419354);
      Blip_Synth_::volume_unit(&(pNVar4->square_synth).impl,local_20 * 0.0064466666666666665);
    }
    if (this->fme7 != (Nes_Fme7_Apu *)0x0) {
      Blip_Synth_::volume_unit(&(this->fme7->synth).impl,local_20 * 0.001979166666666667);
    }
    Nes_Apu::volume(&this->apu,local_20);
    pcVar6 = (blargg_err_t)0x0;
  }
  else {
    this_00 = (Nes_Namco_Apu *)malloc(0x478);
    if (this_00 == (Nes_Namco_Apu *)0x0) {
      this_00 = (Nes_Namco_Apu *)0x0;
    }
    else {
      Nes_Namco_Apu::Nes_Namco_Apu(this_00);
    }
    this->namco = this_00;
    if (this_00 != (Nes_Namco_Apu *)0x0) {
      local_20 = local_20 * 0.75;
      (this->super_Classic_Emu).super_Music_Emu.voice_count_ = 0xd;
      (this->super_Classic_Emu).super_Music_Emu.voice_names_ = init_sound::names;
      goto LAB_006b8fa2;
    }
LAB_006b91e4:
    pcVar6 = "Out of memory";
  }
  return pcVar6;
}

Assistant:

blargg_err_t Nsf_Emu::init_sound()
{
	if ( header_.chip_flags & ~(namco_flag | vrc6_flag | fme7_flag) )
		set_warning( "Uses unsupported audio expansion hardware" );
	
	{
		#define APU_NAMES "Square 1", "Square 2", "Triangle", "Noise", "DMC"
		
		int const count = Nes_Apu::osc_count;
		static const char* const apu_names [count] = { APU_NAMES };
		set_voice_count( count );
		set_voice_names( apu_names );
		
	}
	
	static int const types [] = {
		wave_type  | 1, wave_type  | 2, wave_type | 0,
		noise_type | 0, mixed_type | 1,
		wave_type  | 3, wave_type  | 4, wave_type | 5,
		wave_type  | 6, wave_type  | 7, wave_type | 8, wave_type | 9,
		wave_type  |10, wave_type  |11, wave_type |12, wave_type |13
	};
	set_voice_types( types ); // common to all sound chip configurations
	
	double adjusted_gain = gain();
	
	#if NSF_EMU_APU_ONLY
	{
		if ( header_.chip_flags )
			set_warning( "Uses unsupported audio expansion hardware" );
	}
	#else
	{
		if ( header_.chip_flags & (namco_flag | vrc6_flag | fme7_flag) )
			set_voice_count( Nes_Apu::osc_count + 3 );
		
		if ( header_.chip_flags & namco_flag )
		{
			namco = BLARGG_NEW Nes_Namco_Apu;
			CHECK_ALLOC( namco );
			adjusted_gain *= 0.75;
			
			int const count = Nes_Apu::osc_count + Nes_Namco_Apu::osc_count;
			static const char* const names [count] = {
				APU_NAMES,
				"Wave 1", "Wave 2", "Wave 3", "Wave 4",
				"Wave 5", "Wave 6", "Wave 7", "Wave 8"
			};
			set_voice_count( count );
			set_voice_names( names );
		}
		
		if ( header_.chip_flags & vrc6_flag )
		{
			vrc6 = BLARGG_NEW Nes_Vrc6_Apu;
			CHECK_ALLOC( vrc6 );
			adjusted_gain *= 0.75;
			
			{
				int const count = Nes_Apu::osc_count + Nes_Vrc6_Apu::osc_count;
				static const char* const names [count] = {
					APU_NAMES,
					"Saw Wave", "Square 3", "Square 4"
				};
				set_voice_count( count );
				set_voice_names( names );
			}
			
			if ( header_.chip_flags & namco_flag )
			{
				int const count = Nes_Apu::osc_count + Nes_Vrc6_Apu::osc_count +
						Nes_Namco_Apu::osc_count;
				static const char* const names [count] = {
					APU_NAMES,
					"Saw Wave", "Square 3", "Square 4",
					"Wave 1", "Wave 2", "Wave 3", "Wave 4",
					"Wave 5", "Wave 6", "Wave 7", "Wave 8"
				};
				set_voice_count( count );
				set_voice_names( names );
			}
		}
		
		if ( header_.chip_flags & fme7_flag )
		{
			fme7 = BLARGG_NEW Nes_Fme7_Apu;
			CHECK_ALLOC( fme7 );
			adjusted_gain *= 0.75;
			
			int const count = Nes_Apu::osc_count + Nes_Fme7_Apu::osc_count;
			static const char* const names [count] = {
				APU_NAMES,
				"Square 3", "Square 4", "Square 5"
			};
			set_voice_count( count );
			set_voice_names( names );
		}
		
		if ( namco ) namco->volume( adjusted_gain );
		if ( vrc6  ) vrc6 ->volume( adjusted_gain );
		if ( fme7  ) fme7 ->volume( adjusted_gain );
	}
	#endif
	
	apu.volume( adjusted_gain );
	
	return 0;
}